

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O3

void __thiscall
geemuboi::test::core::CpuTest_add_hl_bc_half_carry_and_carry_Test::TestBody
          (CpuTest_add_hl_bc_half_carry_and_carry_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  Registers expected_regs;
  Message local_40;
  AssertHelper local_38;
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  Registers local_20;
  
  (this->super_CpuTest).regs.f = 0x80;
  (this->super_CpuTest).regs.h = 0xff;
  (this->super_CpuTest).regs.l = 0xff;
  (this->super_CpuTest).regs.c = '\x01';
  CpuTest::execute_instruction(&this->super_CpuTest,'\t');
  local_20.a = '\0';
  local_20.b = '\0';
  local_20.c = '\x01';
  local_20.d = '\0';
  local_20.e = '\0';
  local_20.h = '\0';
  local_20.l = '\0';
  local_20.f = 0xb0;
  local_20.pc = 1;
  local_20.sp = 0;
  CpuTest::verify_state_changes(&this->super_CpuTest,&local_20);
  local_40.ss_.ptr_._0_4_ =
       (*((this->super_CpuTest).cpu._M_t.
          super___uniq_ptr_impl<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>.
          _M_t.
          super__Tuple_impl<0UL,_geemuboi::core::ICpu_*,_std::default_delete<geemuboi::core::ICpu>_>
          .super__Head_base<0UL,_geemuboi::core::ICpu_*,_false>._M_head_impl)->_vptr_ICpu[1])();
  local_38.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            (local_30,"cpu->get_cycles_executed()","2",(uint *)&local_40,(int *)&local_38);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message(&local_40);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
               ,0x131,message);
    testing::internal::AssertHelper::operator=(&local_38,&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (CONCAT44(local_40.ss_.ptr_._4_4_,(int)local_40.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_40.ss_.ptr_._4_4_,(int)local_40.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_40.ss_.ptr_._4_4_,(int)local_40.ss_.ptr_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(CpuTest, add_hl_bc_half_carry_and_carry) {
    regs.f = ICpu::Z_FLAG;
    regs.h = 0xFF;
    regs.l = 0xFF;
    regs.c = 1;
    execute_instruction(0x09);

    ICpu::Registers expected_regs{};
    expected_regs.c = 1;
    expected_regs.f = ICpu::Z_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;
    expected_regs.pc = 1;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}